

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_with(REF_EDGE ref_edge,REF_INT node0,REF_INT node1,REF_INT *edge)

{
  int iVar1;
  int iVar2;
  REF_ADJ_ITEM pRVar3;
  ulong uVar4;
  REF_INT RVar5;
  
  *edge = -1;
  uVar4 = 0xffffffff;
  if (-1 < node0) {
    uVar4 = 0xffffffff;
    if (node0 < ref_edge->adj->nnode) {
      uVar4 = (ulong)(uint)ref_edge->adj->first[(uint)node0];
    }
  }
  if ((int)uVar4 != -1) {
    RVar5 = ref_edge->adj->item[(int)uVar4].ref;
    do {
      iVar1 = ref_edge->e2n[RVar5 * 2];
      iVar2 = ref_edge->e2n[RVar5 * 2 + 1];
      if ((iVar2 == node1 && iVar1 == node0) || (iVar2 == node0 && iVar1 == node1)) {
        *edge = RVar5;
        return 0;
      }
      pRVar3 = ref_edge->adj->item;
      iVar1 = pRVar3[(int)uVar4].next;
      uVar4 = (ulong)iVar1;
      if (uVar4 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar3[uVar4].ref;
      }
    } while (iVar1 != -1);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_edge_with(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1, REF_INT *edge) {
  REF_INT item, ref;
  REF_INT n0, n1;

  *edge = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_edge_adj(ref_edge), node0, item, ref) {
    n0 = ref_edge_e2n(ref_edge, 0, ref);
    n1 = ref_edge_e2n(ref_edge, 1, ref);
    if ((n0 == node0 && n1 == node1) || (n0 == node1 && n1 == node0)) {
      *edge = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}